

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::~DeviceContextVkImpl(DeviceContextVkImpl *this)

{
  pointer pVVar1;
  unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
  *__ptr_00;
  pointer pMVar2;
  pointer puVar3;
  pointer puVar4;
  pointer ppVVar5;
  RenderingInfoWrapper *__ptr_01;
  pointer pVVar6;
  char (*in_RCX) [40];
  char (*in_R8) [119];
  long lVar7;
  pointer *__ptr;
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *pRVar8;
  long lVar9;
  string _msg;
  Uint8 local_49;
  string local_48;
  
  if ((this->m_State).NumCommands != 0) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
      local_49 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.ContextId;
      FormatString<char[53],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[119]>
                (&local_48,(Diligent *)"There are outstanding commands in deferred context #",
                 (char (*) [53])&local_49,
                 (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)
                 " being destroyed, which indicates that FinishCommandList() has not been called. This may cause synchronization issues."
                 ,in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      FormatString<char[126],char[40]>
                (&local_48,
                 (Diligent *)
                 "There are outstanding commands in the immediate context being destroyed, which indicates the context has not been Flush()\'ed."
                 ,(char (*) [126])0x6bad7e,in_RCX);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
    Flush(this,0,(ICommandList **)0x0);
  }
  FinishFrame(this);
  if ((this->m_UploadHeap).m_Pages.
      super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_UploadHeap).m_Pages.
      super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    FormatString<char[70]>
              (&local_48,
               (char (*) [70])
               "All allocated upload heap pages must have been released at this point");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"~DeviceContextVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_DynamicHeap).m_MasterBlocks.
      super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_DynamicHeap).m_MasterBlocks.
      super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    FormatString<char[65]>
              (&local_48,
               (char (*) [65])"All allocated dynamic heap master blocks must have been released");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"~DeviceContextVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_DynamicDescrSetAllocator).m_AllocatedPools.
      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_DynamicDescrSetAllocator).m_AllocatedPools.
      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    FormatString<char[81]>
              (&local_48,
               (char (*) [81])
               "All allocated dynamic descriptor set pools must have been released at this point");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"~DeviceContextVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_QueueFamilyCmdPools)._M_t.
      super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
      .
      super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
      ._M_head_impl !=
      (unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
       *)0x0) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<std::unique_ptr<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[],std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[]>>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject,
               &this->m_QueueFamilyCmdPools,0xffffffffffffffff);
  }
  VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
  ~VulkanObjectWrapper(&this->m_ASQueryPool);
  pVVar1 = (this->m_vkClearValues).super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_vkClearValues).
                                 super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&this->m_DummyVB);
  DynamicDescriptorSetAllocator::~DynamicDescriptorSetAllocator(&this->m_DynamicDescrSetAllocator);
  VulkanDynamicHeap::~VulkanDynamicHeap(&this->m_DynamicHeap);
  VulkanUploadHeap::~VulkanUploadHeap(&this->m_UploadHeap);
  __ptr_00 = (this->m_QueueFamilyCmdPools)._M_t.
             super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
             .
             super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
             ._M_head_impl;
  if (__ptr_00 !=
      (unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
       *)0x0) {
    std::
    default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[]>
    ::operator()((default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[]>
                  *)&this->m_QueueFamilyCmdPools,__ptr_00);
  }
  (this->m_QueueFamilyCmdPools)._M_t.
  super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
        *)0x0;
  pMVar2 = (this->m_MappedBuffers).
           super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar2 != (pointer)0x0) {
    operator_delete(pMVar2,(long)(this->m_MappedBuffers).
                                 super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar2);
  }
  std::
  _Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,_std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_MappedTextures)._M_h);
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::~vector(&this->m_WaitFences);
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::~vector(&this->m_SignalFences);
  puVar3 = (this->m_SignalSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_SignalSemaphoreValues).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar3 = (this->m_WaitSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_WaitSemaphoreValues).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar4 = (this->m_WaitDstStageMasks).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_WaitDstStageMasks).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  ppVVar5 = (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar5 != (pointer)0x0) {
    operator_delete(ppVVar5,(long)(this->m_VkSignalSemaphores).
                                  super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar5
                   );
  }
  ppVVar5 = (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar5 != (pointer)0x0) {
    operator_delete(ppVVar5,(long)(this->m_VkWaitSemaphores).
                                  super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar5
                   );
  }
  std::
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
  ::~vector(&this->m_WaitRecycledSemaphores);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::~vector(&this->m_SignalManagedSemaphores);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::~vector(&this->m_WaitManagedSemaphores);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_CmdListAllocator);
  __ptr_01 = (this->m_DynamicRenderingInfo)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
  if (__ptr_01 != (RenderingInfoWrapper *)0x0) {
    std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
              ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)
               &this->m_DynamicRenderingInfo,__ptr_01);
  }
  (this->m_DynamicRenderingInfo)._M_t.
  super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl =
       (RenderingInfoWrapper *)0x0;
  puVar4 = (this->m_DynamicBufferOffsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_DynamicBufferOffsets).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  pRVar8 = (this->m_BindInfo)._M_elems[2].super_CommittedShaderResources.SRBs._M_elems + 7;
  lVar9 = 0xdd0;
  do {
    lVar9 = lVar9 + -0x1f0;
    lVar7 = 0;
    do {
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)
                 ((long)&pRVar8->m_pRefCounters + lVar7));
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != -0x80);
    pRVar8 = pRVar8 + -0x1f;
  } while (lVar9 != 0x800);
  pVVar6 = (this->m_CommandBuffer).m_ImageBarriers.
           super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar6 != (pointer)0x0) {
    operator_delete(pVVar6,(long)(this->m_CommandBuffer).m_ImageBarriers.
                                 super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar6);
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::~DeviceContextBase
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  return;
}

Assistant:

DeviceContextVkImpl::~DeviceContextVkImpl()
{
    if (m_State.NumCommands != 0)
    {
        if (IsDeferred())
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in deferred context #", GetContextId(),
                              " being destroyed, which indicates that FinishCommandList() has not been called."
                              " This may cause synchronization issues.");
        }
        else
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in the immediate context being destroyed, "
                              "which indicates the context has not been Flush()'ed.",
                              " This may cause synchronization issues.");
        }
    }

    if (!IsDeferred())
    {
        Flush();
    }

    // For deferred contexts, m_SubmittedBuffersCmdQueueMask is reset to 0 after every call to FinishFrame().
    // In this case there are no resources to release, so there will be no issues.
    FinishFrame();

    // There must be no stale resources
    // clang-format off
    DEV_CHECK_ERR(m_UploadHeap.GetStalePagesCount()                  == 0, "All allocated upload heap pages must have been released at this point");
    DEV_CHECK_ERR(m_DynamicHeap.GetAllocatedMasterBlockCount()       == 0, "All allocated dynamic heap master blocks must have been released");
    DEV_CHECK_ERR(m_DynamicDescrSetAllocator.GetAllocatedPoolCount() == 0, "All allocated dynamic descriptor set pools must have been released at this point");
    // clang-format on

    // NB: If there are any command buffers in the release queue, they will always be returned to the pool
    //     before the pool itself is released because the pool will always end up later in the queue,
    //     so we do not need to idle the GPU.
    //     Also note that command buffers are disposed directly into the release queue, but
    //     the command pool goes into the stale objects queue and is moved into the release queue
    //     when the next command buffer is submitted.
    if (m_QueueFamilyCmdPools)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_QueueFamilyCmdPools), ~Uint64{0});

    // NB: Upload heap, dynamic heap and dynamic descriptor manager return their resources to
    //     global managers and do not need to wait for GPU to idle.
}